

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_renegotiation_info(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->renego_status == 0) {
    if ((len != 1) || (*buf != '\0')) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xad,"non-zero length renegotiation info");
      iVar1 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
      if (iVar1 != 0) {
        return iVar1;
      }
      return -0x7900;
    }
    ssl->secure_renegotiation = 1;
  }
  else if (((len != ssl->verify_data_len + 1) || ((ulong)*buf != ssl->verify_data_len)) ||
          (iVar1 = mbedtls_ssl_safer_memcmp(buf + 1,ssl->peer_verify_data,ssl->verify_data_len),
          iVar1 != 0)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xa0,"non-matching renegotiation info");
    iVar1 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
    if (iVar1 != 0) {
      return iVar1;
    }
    return -0x7900;
  }
  return 0;
}

Assistant:

static int ssl_parse_renegotiation_info( mbedtls_ssl_context *ssl,
                                         const unsigned char *buf,
                                         size_t len )
{
    int ret;

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE )
    {
        /* Check verify-data in constant-time. The length OTOH is no secret */
        if( len    != 1 + ssl->verify_data_len ||
            buf[0] !=     ssl->verify_data_len ||
            mbedtls_ssl_safer_memcmp( buf + 1, ssl->peer_verify_data,
                          ssl->verify_data_len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-matching renegotiation info" ) );

            if( ( ret = mbedtls_ssl_send_fatal_handshake_failure( ssl ) ) != 0 )
                return( ret );

            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
        }
    }
    else
#endif /* MBEDTLS_SSL_RENEGOTIATION */
    {
        if( len != 1 || buf[0] != 0x0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-zero length renegotiation info" ) );

            if( ( ret = mbedtls_ssl_send_fatal_handshake_failure( ssl ) ) != 0 )
                return( ret );

            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
        }

        ssl->secure_renegotiation = MBEDTLS_SSL_SECURE_RENEGOTIATION;
    }

    return( 0 );
}